

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

void __thiscall Graph::calc_node_distance(Graph *this)

{
  long lVar1;
  Node *pNVar2;
  double **ppdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  long local_40;
  
  if (0 < this->num_node) {
    local_40 = 1;
    lVar4 = 0x24;
    lVar5 = 0;
    do {
      lVar1 = lVar5 + 1;
      lVar6 = local_40;
      lVar7 = lVar4;
      if (lVar1 < this->num_node) {
        do {
          pNVar2 = this->nodes;
          dVar9 = (double)(pNVar2[lVar5].x - *(int *)((long)pNVar2 + lVar7 + -4));
          dVar8 = (double)(pNVar2[lVar5].y - *(int *)((long)&pNVar2->x + lVar7));
          dVar8 = dVar8 * dVar8 + dVar9 * dVar9;
          if (dVar8 < 0.0) {
            dVar8 = sqrt(dVar8);
          }
          else {
            dVar8 = SQRT(dVar8);
          }
          ppdVar3 = this->distance_matrix;
          ppdVar3[lVar6][lVar5] = dVar8;
          ppdVar3[lVar5][lVar6] = dVar8;
          lVar6 = lVar6 + 1;
          lVar7 = lVar7 + 0x20;
        } while ((int)lVar6 < this->num_node);
      }
      local_40 = local_40 + 1;
      lVar4 = lVar4 + 0x20;
      lVar5 = lVar1;
    } while (lVar1 < this->num_node);
  }
  return;
}

Assistant:

void Graph::calc_node_distance()
{
	for(int i = 0; i < num_node; i++){
		for(int j = i + 1; j < num_node; j++){
			distance_matrix[i][j] = distance_matrix[j][i] = sqrt(pow(nodes[i].x - nodes[j].x, 2) + pow(nodes[i].y - nodes[j].y, 2));
		}
	}
}